

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O1

NMConnectivityState __thiscall
QNetworkManagerInterface::connectivityState(QNetworkManagerInterface *this)

{
  NMConnectivityState NVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  
  anon_unknown.dwarf_38154::connectivityKey();
  if (*(long *)(this + 0x10) == 0) {
    cVar2._M_node = (_Base_ptr)0x0;
  }
  else {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
            ::find((_Rb_tree<QString,_std::pair<const_QString,_QVariant>,_std::_Select1st<std::pair<const_QString,_QVariant>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                    *)(*(long *)(this + 0x10) + 8),&anon_unknown.dwarf_38154::connectivityKey::key);
  }
  p_Var3 = (_Base_ptr)(*(long *)(this + 0x10) + 0x10);
  if (*(long *)(this + 0x10) == 0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  if (cVar2._M_node != p_Var3) {
    NVar1 = QVariant::toUInt((bool *)&cVar2._M_node[1]._M_right);
    return NVar1;
  }
  return NM_CONNECTIVITY_UNKNOWN;
}

Assistant:

QNetworkManagerInterface::NMConnectivityState QNetworkManagerInterface::connectivityState() const
{
    auto it = propertyMap.constFind(connectivityKey());
    if (it != propertyMap.cend())
        return static_cast<NMConnectivityState>(it->toUInt());
    return QNetworkManagerInterface::NM_CONNECTIVITY_UNKNOWN;
}